

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O2

void av1_set_speed_features_framesize_dependent(AV1_COMP *cpi,int speed)

{
  MODE MVar1;
  FRAME_UPDATE_TYPE FVar2;
  _Bool _Var3;
  AV1_PRIMARY *pAVar4;
  SequenceHeader *pSVar5;
  byte bVar6;
  int iVar7;
  int i;
  int64_t iVar8;
  ulong uVar9;
  BLOCK_SIZE BVar10;
  _Bool _Var11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  undefined4 uVar20;
  int iVar21;
  bool bVar22;
  
  MVar1 = (cpi->oxcf).mode;
  iVar7 = 3;
  if (MVar1 != '\x02') {
    uVar20 = 1;
    if (MVar1 != '\x01') {
      if (MVar1 != '\0') goto LAB_00208316;
      iVar7 = (cpi->common).width;
      iVar16 = (cpi->common).height;
      if (iVar7 < iVar16) {
        iVar16 = iVar7;
      }
      _Var11 = (cpi->oxcf).use_highbitdepth;
      iVar7 = frame_is_boosted(cpi);
      pAVar4 = cpi->ppi;
      if (iVar7 == 0) {
        uVar9 = (ulong)cpi->gf_frame_index;
        bVar22 = (pAVar4->gf_group).update_type[uVar9] == '\x06';
      }
      else {
        uVar9 = (ulong)cpi->gf_frame_index;
        bVar22 = true;
      }
      FVar2 = (pAVar4->gf_group).update_type[uVar9];
      if (iVar16 < 0x1e0) {
        (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01';
        if (_Var11 != false) {
          (cpi->sf).tx_sf.prune_tx_size_level = 1;
        }
LAB_002071d7:
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 500;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
        (cpi->sf).part_sf.ml_early_term_after_part_split_level = 1;
        iVar21 = (cpi->oxcf).rc_cfg.under_shoot_pct;
        iVar12 = (cpi->oxcf).rc_cfg.over_shoot_pct;
        if (iVar21 < iVar12) {
          iVar12 = iVar21;
        }
        (cpi->sf).hl_sf.recode_tolerance = (iVar12 >> 2) + 0x19;
      }
      else {
        (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
        if (iVar16 < 0x2d0) {
          (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x02';
          goto LAB_002071d7;
        }
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x03';
        if (0x86f < iVar16) {
          (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
        }
        (cpi->sf).mv_sf.use_downsampled_sad = 2;
      }
      if (0 < speed) {
        _Var3 = (cpi->common).features.allow_screen_content_tools;
        if (iVar16 < 0x1e1) {
          (cpi->sf).inter_sf.skip_newmv_in_drl = 1;
          BVar10 = (0x1df < iVar16) * '\x03' + BLOCK_32X32;
LAB_002072c3:
          (cpi->sf).part_sf.use_square_partition_only_threshold = BVar10;
          (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
          (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
          (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
          (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 300;
          (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
          (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
          (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
          if (speed != 1) {
            (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_32X32;
            (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x400000;
            (cpi->sf).part_sf.partition_search_breakout_rate_thr = 100;
            (cpi->sf).inter_sf.prune_obmc_prob_thresh = 8;
            if (0x1df < iVar16) {
              (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 100;
              if (iVar16 < 0x1e1) {
                (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 1;
              }
              uVar13 = (uint)(FVar2 == '\x01') * 2;
              goto LAB_002075f7;
            }
            (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0xffffffff;
            (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 1;
            (cpi->sf).inter_sf.limit_inter_mode_cands = (uint)(FVar2 == '\x01') * 2;
            if (_Var11 != false) {
              (cpi->sf).tx_sf.prune_tx_size_level = 3;
            }
            (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = (uint)(iVar7 == 0);
            (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = (uint)(iVar7 == 0);
            goto LAB_0020763f;
          }
        }
        else {
          BVar10 = BLOCK_64X64;
          if (iVar16 < 0x2d0) goto LAB_002072c3;
          (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
          (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
          (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
          if (speed == 1) goto LAB_0020828f;
          uVar13 = (uint)(FVar2 == '\x01');
          (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
          (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x1000000;
          (cpi->sf).part_sf.partition_search_breakout_rate_thr = 0x78;
          (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0x10;
          (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 100;
LAB_002075f7:
          (cpi->sf).inter_sf.limit_inter_mode_cands = uVar13;
          (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 1;
          if (_Var11 != false) {
            (cpi->sf).tx_sf.prune_tx_size_level = 2;
          }
          if (iVar16 < 0x2d0) {
LAB_0020763f:
            (cpi->sf).mv_sf.disable_second_mv = 1;
            (cpi->sf).mv_sf.auto_mv_step_size = 2;
            (cpi->sf).hl_sf.recode_tolerance = 0x32;
            (cpi->sf).inter_sf.disable_interinter_wedge_newmv_search = (uint)(bVar22 ^ 1);
            (cpi->sf).inter_sf.enable_fast_wedge_mask_search = 1;
          }
          else {
            (cpi->sf).mv_sf.disable_second_mv = (uint)(iVar7 == 0) * 2;
            (cpi->sf).mv_sf.auto_mv_step_size = 1;
          }
          if (2 < (uint)speed) {
            uVar13 = (uint)(iVar7 == 0);
            bVar6 = (cpi->common).current_frame.frame_type;
            (cpi->sf).part_sf.ml_early_term_after_part_split_level = 0;
            (cpi->sf).inter_sf.enable_fast_wedge_mask_search = 1;
            (cpi->sf).inter_sf.skip_newmv_in_drl = 2;
            (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 1;
            (cpi->sf).inter_sf.limit_inter_mode_cands = (uint)(FVar2 == '\x01') * 3;
            (cpi->sf).inter_sf.disable_interinter_wedge_newmv_search = uVar13;
            (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 1;
            uVar14 = (uint)((bVar6 & 0xfd) != 0);
            (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = uVar14;
            if (iVar16 < 0x2d0) {
              iVar21 = 0x78;
              uVar17 = (uint)(FVar2 == '\x01');
              (cpi->sf).part_sf.max_intra_bsize = BLOCK_32X32;
              iVar8 = 0x800000;
            }
            else {
              uVar17 = (uint)(FVar2 == '\x01') * 2;
              iVar21 = 200;
              iVar8 = 0x2000000;
            }
            (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar8;
            (cpi->sf).part_sf.partition_search_breakout_rate_thr = iVar21;
            (cpi->sf).part_sf.skip_non_sq_part_based_on_none = uVar17;
            if (_Var11 != false) {
              (cpi->sf).tx_sf.prune_tx_size_level = 3;
            }
            if (iVar16 < 0x1e0) {
              (cpi->sf).part_sf.early_term_after_none_split = 0;
LAB_0020778b:
              (cpi->sf).intra_sf.skip_intra_in_interframe = (uint)(iVar7 == 0) * 2 + 1;
              (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 0xffffffff;
              uVar17 = 2;
              iVar21 = (uint)(iVar7 == 0) * 2;
              lVar18 = 0x3a4;
              lVar19 = 0x274;
            }
            else {
              (cpi->sf).part_sf.early_term_after_none_split = 1;
              if (iVar16 < 0x2d0) goto LAB_0020778b;
              (cpi->sf).intra_sf.skip_intra_in_interframe = (iVar7 == 0) + 1;
              lVar18 = 0x274;
              iVar21 = 100;
              lVar19 = 0x22c;
              uVar17 = uVar13;
            }
            *(int *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar19) = iVar21;
            *(uint *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar18) = uVar17;
            (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0xffffffff;
            if (speed != 3) {
              (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 2;
              (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
              if (iVar16 < 0x2d0) {
                (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x1000000;
                (cpi->sf).part_sf.early_term_after_none_split = 1;
                if (0x1df < iVar16) goto LAB_0020788b;
                (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = uVar13;
              }
              else {
                (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
                (cpi->sf).part_sf.early_term_after_none_split = 1;
LAB_0020788b:
                (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
              }
              (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 0xffffffff;
              iVar21 = (uint)(iVar7 == 0) * 2;
              (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0x7fffffff;
              (cpi->sf).inter_sf.limit_txfm_eval_per_mode = iVar21;
              if (iVar16 < 0x1e1) {
                (cpi->sf).inter_sf.skip_newmv_in_drl = 3;
                if (0x1df < iVar16) {
LAB_002080bc:
                  (cpi->sf).inter_sf.prune_comp_ref_frames = (uint)(bVar22 ^ 1);
                }
                (cpi->sf).hl_sf.recode_tolerance = 0x37;
                (cpi->sf).intra_sf.skip_intra_in_interframe = 4;
                (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
                if ((uint)speed < 5) goto LAB_0020828f;
                if (0x1df < iVar16) {
                  (cpi->sf).inter_sf.prune_warped_prob_thresh = 8;
                }
                (cpi->sf).inter_sf.prune_comp_ref_frames = 1;
                (cpi->sf).inter_sf.skip_newmv_in_drl = 4;
                (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = uVar13;
                (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW_SET;
                (cpi->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight =
                     (uint)(iVar7 == 0 & (_Var3 ^ 1U));
                (cpi->sf).mv_sf.use_downsampled_sad = 1;
                if (0x1df < iVar16) {
                  if (iVar16 < 0x1e1) {
                    (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x01';
                  }
                  else {
                    (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x02';
                  }
                  goto LAB_0020817e;
                }
                (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
                (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x01';
              }
              else {
                if (iVar16 < 0x2d0) goto LAB_002080bc;
                (cpi->sf).inter_sf.prune_comp_ref_frames = 1;
                (cpi->sf).hl_sf.recode_tolerance = 0x20;
                (cpi->sf).intra_sf.skip_intra_in_interframe = 4;
                (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
                if ((uint)speed < 5) goto LAB_0020828f;
                (cpi->sf).inter_sf.prune_warped_prob_thresh = 0x10;
                (cpi->sf).hl_sf.recode_tolerance = 0x28;
                (cpi->sf).inter_sf.skip_newmv_in_drl = 4;
                (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = uVar13;
                (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x02';
                if (_Var3 != false) {
                  uVar14 = 0;
                }
                (cpi->sf).part_sf.ext_part_eval_based_on_cur_best = uVar14;
LAB_0020817e:
                (cpi->sf).tpl_sf.reduce_num_frames = 1;
              }
              if (5 < (uint)speed) {
                (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 4;
                (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x03';
                (cpi->sf).inter_sf.prune_comp_ref_frames = 2;
                (cpi->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight =
                     (uint)(iVar7 == 0 & (_Var3 ^ 1U));
                (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = iVar21;
                if (iVar16 < 0x2d0) {
                  if (0x1df < iVar16) {
                    (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01';
                    (cpi->sf).hl_sf.allow_sub_blk_me_in_tf = 1;
                  }
                  (cpi->sf).inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_SBROW;
                  (cpi->sf).inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_SBROW;
                  (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16;
                  (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
                  (cpi->sf).inter_sf.prune_ref_mv_idx_search = 1;
                  uVar20 = 0x96;
                  if (bVar22 != false) {
                    uVar20 = 0x1c2;
                  }
                  lVar18 = 800;
                }
                else {
                  (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\0';
                  (cpi->sf).hl_sf.allow_sub_blk_me_in_tf = 1;
                  if (0x437 < iVar16) {
                    (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
                  }
                  (cpi->sf).inter_sf.disable_masked_comp = 1;
                  (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_32X32;
                  (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x10000000;
                  uVar20 = 2;
                  lVar18 = 0x218;
                }
                *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar18) = uVar20;
                (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL4;
                (cpi->sf).hl_sf.recode_tolerance = 0x37;
              }
            }
          }
        }
      }
LAB_0020828f:
      if ((speed - 4U < 0xfffffffd) || ((cpi->oxcf).enable_low_complexity_decode == 0))
      goto LAB_00208316;
      bVar6 = (pAVar4->gf_group).update_type[uVar9];
      if (iVar16 < 0x260) {
        if (0xee < iVar16 - 0x1e1U) goto LAB_00208316;
LAB_002082f4:
        lVar18 = 0x30;
        if ((bVar6 < 6) && ((0x32U >> (bVar6 & 0x1f) & 1) != 0)) {
          (cpi->sf).gm_sf.gm_search_type = '\x04';
        }
      }
      else {
        uVar13 = 0;
        if ((byte)(bVar6 - 6) < 0xfe) {
          uVar13 = (uint)(1 < (cpi->common).current_frame.pyramid_level);
        }
        (cpi->sf).lpf_sf.skip_loop_filter_using_filt_error = uVar13;
        lVar18 = 0x88;
        if (iVar16 - 0x1e1U < 0xef) goto LAB_002082f4;
      }
      *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar18) = 1;
      goto LAB_00208316;
    }
    iVar7 = frame_is_boosted(cpi);
    uVar13 = (cpi->common).width;
    uVar14 = (cpi->common).height;
    uVar17 = uVar14;
    if ((int)uVar13 < (int)uVar14) {
      uVar17 = uVar13;
    }
    if ((int)uVar17 < 0x168) {
      (cpi->sf).rt_sf.prune_intra_mode_based_on_mv_range = BLOCK_4X8;
      (cpi->sf).rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 1;
      if ((speed < 6) ||
         ((cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = (uint)(iVar7 == 0) * 2, speed == 6
         )) goto LAB_002079d2;
      if (speed == 7) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 2;
      }
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
      (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = true;
      (cpi->sf).rt_sf.use_rtc_tf = 2;
      if (speed == 8) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 1;
        lVar18 = 0x500;
LAB_0020781a:
        bVar22 = false;
LAB_0020781c:
        *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar18) = uVar20;
      }
      else {
        if ((uint)speed < 8) {
          uVar20 = 2;
          lVar18 = 0x3e0;
          goto LAB_0020781a;
        }
        (cpi->sf).rt_sf.use_nonrd_filter_search = 1;
        (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 1;
        (cpi->sf).rt_sf.use_comp_ref_nonrd = 0;
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
        (cpi->sf).rt_sf.skip_intra_pred = 1;
        (cpi->sf).rt_sf.enable_ref_short_signaling = (cpi->sf).rt_sf.use_nonrd_altref_frame == 0;
        (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
        if ((uint)speed < 10) goto LAB_002074d1;
        (cpi->sf).rt_sf.skip_intra_pred = 2;
        (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 0;
        (cpi->sf).rt_sf.hybrid_intra_pickmode = 3;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
        (cpi->sf).rt_sf.force_large_partition_blocks_intra = 1;
LAB_00207935:
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
LAB_0020793f:
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
LAB_00207949:
        if ((uint)speed < 0xb) goto LAB_002079d2;
        bVar22 = true;
        if ((cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN) {
          (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
          (cpi->sf).rt_sf.skip_cdef_sb = 1;
          (cpi->sf).rt_sf.selective_cdf_update = 1;
          (cpi->sf).rt_sf.force_only_last_ref = 1;
          if (0x167 < (int)uVar17) {
            (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
            (cpi->sf).rt_sf.use_fast_fixed_part = 1;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 2;
          }
          (cpi->sf).rt_sf.increase_source_sad_thresh = 1;
          (cpi->sf).rt_sf.part_early_exit_zeromv = 2;
          (cpi->sf).rt_sf.set_zeromv_skip_based_on_source_sad = 2;
          uVar20 = 0;
          for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
            (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[lVar18] = 1;
          }
          bVar22 = true;
          lVar18 = 0x420;
          goto LAB_0020781c;
        }
      }
    }
    else {
      (cpi->sf).rt_sf.prune_intra_mode_based_on_mv_range = BLOCK_8X4;
      (cpi->sf).intra_sf.skip_filter_intra_in_inter_frames = 1;
      if (5 < speed) {
        if (speed == 6) {
          (cpi->sf).part_sf.disable_8x8_part_based_on_qidx = 1;
          (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 2;
          goto LAB_002070ad;
        }
        (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 2;
        if (speed != 7) {
          (cpi->sf).rt_sf.use_rtc_tf = 1;
          if (speed == 8) {
            if (cpi->ppi->use_svc == 0) {
              (cpi->sf).rt_sf.short_circuit_low_temp_var = 0;
              (cpi->sf).rt_sf.use_nonrd_altref_frame = 1;
            }
            (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 2;
          }
          else {
            (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 2;
            (cpi->sf).rt_sf.gf_length_lvl = 1;
            (cpi->sf).rt_sf.skip_cdef_sb = 1;
            (cpi->sf).rt_sf.sad_based_adp_altref_lag = 2;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
            (cpi->sf).rt_sf.use_adaptive_subpel_search = true;
            (cpi->sf).interp_sf.cb_pred_filter_search = 1;
            if (9 < (uint)speed) {
              (cpi->sf).rt_sf.hybrid_intra_pickmode = 2;
              (cpi->sf).rt_sf.sad_based_adp_altref_lag = 4;
              (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 0;
              (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
              (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
              (cpi->sf).interp_sf.cb_pred_filter_search = 2;
            }
          }
          goto LAB_002070ad;
        }
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 1;
        if (((uVar17 < 0x2d1) && ((cpi->rc).rtc_external_ratectrl == 0)) &&
           ((cpi->oxcf).use_highbitdepth == false)) {
          (cpi->sf).hl_sf.accurate_bit_estimate = (uint)((cpi->oxcf).q_cfg.aq_mode == '\0');
        }
        (cpi->sf).rt_sf.use_rtc_tf = 1;
        bVar22 = true;
        if (0x1df < (int)uVar17) goto LAB_002070af;
        bVar22 = false;
        uVar20 = 2;
        lVar18 = 0x3e0;
        goto LAB_0020781c;
      }
      iVar16 = 0x7fffffff;
      if (iVar7 == 0) {
        iVar16 = 0x15e;
      }
      (cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh = iVar16;
      (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = (uint)(iVar7 == 0) * 2;
LAB_002070ad:
      bVar22 = false;
LAB_002070af:
      if ((int)uVar17 < 0x2d0) {
LAB_002074d1:
        if (8 < speed) {
          (cpi->sf).rt_sf.force_large_partition_blocks_intra = 1;
          (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
          if (speed != 9) goto LAB_0020793f;
        }
      }
      else {
        if (5 < speed) {
          (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 3;
        }
        if (bVar22) {
          (cpi->sf).rt_sf.prefer_large_partition_blocks = 0;
        }
        if (6 < speed) {
          (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 1;
          (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 2;
          if (8 < (uint)speed) {
            (cpi->sf).rt_sf.sad_based_adp_altref_lag = 1;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 0;
            if (speed == 9) {
              if ((int)uVar17 < 0x438) {
                uVar20 = 6;
                lVar18 = 0x3a4;
                goto LAB_0020781a;
              }
            }
            else {
              (cpi->sf).rt_sf.sad_based_adp_altref_lag = 3;
              (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
              if ((int)uVar17 < 0x438) goto LAB_00207935;
            }
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
            (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
            (cpi->sf).interp_sf.cb_pred_filter_search = 0;
            goto LAB_00207949;
          }
          if (0x437 < (int)uVar17) {
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
            (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
          }
        }
      }
LAB_002079d2:
      bVar22 = false;
    }
    pAVar4 = cpi->ppi;
    if ((pAVar4->use_svc != 0) || ((pAVar4->rtc_ref).set_ref_frame_config != 0)) {
      iVar7 = (cpi->svc).number_temporal_layers;
      if (((1 < iVar7) && ((cpi->svc).temporal_layer_id == 0)) &&
         (((cpi->svc).spatial_layer_id == 0 ||
          ((cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width < 0x38401)))) {
        (cpi->sf).mv_sf.search_method = '\x01';
        (cpi->sf).mv_sf.subpel_search_method = '\x01';
        (cpi->sf).rt_sf.fullpel_search_step_param = 10;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
        if ((int)(uVar14 * uVar13) < 0x18c01) {
          (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 2;
        }
        (cpi->sf).rt_sf.force_large_partition_blocks_intra = 0;
      }
      if (speed < 8) {
        if (2 < iVar7) goto LAB_00207ab9;
LAB_00207ac6:
        _Var11 = true;
      }
      else {
        if (2 < iVar7) {
          (cpi->sf).rt_sf.disable_cdf_update_non_reference_frame = true;
        }
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
        if ((pAVar4->rtc_ref).non_reference_frame != 0) {
          (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
          (cpi->sf).mv_sf.subpel_search_method = '\x02';
        }
        if (9 < (uint)speed || iVar7 < 3) goto LAB_00207ac6;
LAB_00207ab9:
        if ((cpi->svc).temporal_layer_id != 0) goto LAB_00207ac6;
        _Var11 = false;
      }
      (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = _Var11;
      (cpi->sf).rt_sf.frame_level_mode_cost_update = false;
      if ((((pAVar4->rtc_ref).ref_frame_comp[0] == 0) && ((pAVar4->rtc_ref).ref_frame_comp[1] == 0))
         && ((pAVar4->rtc_ref).ref_frame_comp[2] == 0)) {
        uVar17 = 0;
        lVar18 = 0x3f8;
      }
      else {
        (cpi->sf).rt_sf.use_comp_ref_nonrd = 1;
        uVar17 = 0;
        uVar15 = 0;
        if ((pAVar4->rtc_ref).ref_frame_comp[0] != 0) {
          uVar15 = (uint)((pAVar4->rtc_ref).reference[3] != 0);
        }
        (cpi->sf).rt_sf.ref_frame_comp_nonrd[0] = uVar15;
        if ((pAVar4->rtc_ref).ref_frame_comp[1] != 0) {
          uVar17 = (uint)((pAVar4->rtc_ref).reference[1] != 0);
        }
        (cpi->sf).rt_sf.ref_frame_comp_nonrd[1] = uVar17;
        lVar18 = 0x404;
        if ((pAVar4->rtc_ref).ref_frame_comp[2] == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (uint)((pAVar4->rtc_ref).reference[6] != 0);
        }
      }
      *(uint *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar18) = uVar17;
      if ((1 < iVar7) || (1 < (cpi->svc).number_spatial_layers)) {
        (cpi->sf).hl_sf.accurate_bit_estimate = 0;
      }
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 1;
      if ((pAVar4->rtc_ref).bias_recovery_frame == true) {
        (cpi->sf).mv_sf.search_method = '\x01';
        (cpi->sf).mv_sf.subpel_search_method = '\0';
        (cpi->sf).rt_sf.fullpel_search_step_param = 8;
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 0;
      }
    }
    if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
      if (6 < speed) {
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 1;
        (cpi->sf).mv_sf.use_bsize_dependent_search_method = 0;
        (cpi->sf).rt_sf.skip_cdef_sb = 1;
        (cpi->sf).rt_sf.increase_color_thresh_palette = true;
        if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
          (cpi->sf).rt_sf.dct_only_palette_nonrd = 1;
        }
        if (speed != 7) {
          (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 3;
          (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 1;
          (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
          (cpi->sf).rt_sf.prune_hv_pred_modes_using_src_sad = false;
          if (8 < (uint)speed) {
            (cpi->sf).rt_sf.prune_idtx_nonrd = 1;
            (cpi->sf).rt_sf.part_early_exit_zeromv = 2;
            (cpi->sf).rt_sf.skip_lf_screen = 1;
            (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 3;
            (cpi->sf).rt_sf.var_part_split_threshold_shift = 10;
            (cpi->sf).mv_sf.subpel_search_method = '\x02';
            (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
            (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 1;
            (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
            (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 0;
            (cpi->sf).interp_sf.cb_pred_filter_search = 0;
            if (speed != 9) {
              if (0x1fa400 < (int)(uVar14 * uVar13)) {
                (cpi->sf).part_sf.disable_8x8_part_based_on_qidx = 1;
              }
              (cpi->sf).rt_sf.screen_content_cdef_filter_qindex_thresh = 0x50;
              (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
              (cpi->sf).rt_sf.thresh_active_maps_skip_lf_cdef = 0x5a;
              (cpi->sf).rt_sf.part_early_exit_zeromv = 1;
              (cpi->sf).rt_sf.hybrid_intra_pickmode = 0;
              (cpi->sf).rt_sf.prune_palette_search_nonrd = 1;
              (cpi->sf).rt_sf.dct_only_palette_nonrd = 1;
              (cpi->sf).rt_sf.prune_intra_mode_using_best_sad_so_far = true;
              (cpi->sf).rt_sf.rc_faster_convergence_static = 1;
              (cpi->sf).rt_sf.rc_compute_spatial_var_sc = 1;
            }
          }
        }
      }
      if (bVar22) {
        (cpi->sf).rt_sf.skip_lf_screen = 2;
        (cpi->sf).rt_sf.skip_cdef_sb = 2;
        (cpi->sf).rt_sf.prune_palette_search_nonrd = 2;
        (cpi->sf).rt_sf.increase_color_thresh_palette = false;
        (cpi->sf).rt_sf.prune_h_pred_using_best_mode_so_far = true;
        (cpi->sf).rt_sf.enable_intra_mode_pruning_using_neighbors = true;
      }
      iVar7 = (cpi->rc).high_source_sad;
      iVar16 = iVar7;
      if (0xb < speed) {
        if (iVar7 == 0) {
          iVar16 = 0;
        }
        else if (((40000 < (cpi->rc).frame_source_sad) && ((cpi->rc).prev_avg_source_sad < 1000)) &&
                (0xe0fff < (cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width)) {
          (cpi->sf).rt_sf.prune_palette_search_nonrd = 3;
          (cpi->sf).rt_sf.skip_newmv_mode_sad_screen = 1;
        }
      }
      (cpi->sf).rt_sf.skip_encoding_non_reference_slide_change =
           (uint)(0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark);
      (cpi->sf).rt_sf.higher_thresh_scene_detection = 0;
      (cpi->sf).rt_sf.skip_newmv_flat_blocks_screen = 1;
      (cpi->sf).rt_sf.use_nonrd_altref_frame = 0;
      (cpi->sf).rt_sf.use_comp_ref_nonrd = 0;
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).rt_sf.use_idtx_nonrd = 1;
      (cpi->sf).rt_sf.source_metrics_sb_nonrd = 1;
      if (iVar16 == 1) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 0;
        (cpi->sf).part_sf.max_intra_bsize = BLOCK_128X128;
        for (uVar9 = 0; uVar9 != 0x10; uVar9 = uVar9 + 1) {
          iVar16 = 7;
          if (9 < uVar9) {
            iVar16 = 1;
          }
          (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[uVar9] = iVar16;
        }
      }
      if ((bVar22) && ((cpi->rc).high_motion_content_screen_rtc != 0)) {
        (cpi->sf).rt_sf.higher_thresh_scene_detection = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
        (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
        (cpi->sf).rt_sf.use_fast_fixed_part = 1;
        (cpi->sf).rt_sf.increase_source_sad_thresh = 1;
        (cpi->sf).rt_sf.selective_cdf_update = 1;
        (cpi->sf).rt_sf.force_only_last_ref = 1;
        (cpi->sf).mv_sf.search_method = '\b';
      }
      else if (((20000 < (cpi->rc).max_block_source_sad) &&
               ((5 < speed && (100 < (cpi->rc).frame_source_sad)))) &&
              ((1 < (cpi->rc).percent_blocks_with_motion ||
               ((cpi->svc).last_layer_dropped[0] == true)))) {
        (cpi->sf).mv_sf.search_method = '\x01';
        (cpi->sf).rt_sf.fullpel_search_step_param = 2;
      }
      if ((iVar7 != 0) && ((pAVar4->rtc_ref).non_reference_frame != 0)) {
        (cpi->sf).rt_sf.use_idtx_nonrd = 0;
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 1;
        (cpi->sf).mv_sf.subpel_search_method = '\x02';
        (cpi->sf).rt_sf.fullpel_search_step_param = 10;
      }
      (cpi->sf).rt_sf.partition_direct_merging = 0;
      (cpi->sf).hl_sf.accurate_bit_estimate = 0;
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition =
           (uint)((cpi->sf).rt_sf.use_nonrd_pick_mode != 0);
    }
    if (((cpi->oxcf).rc_cfg.best_allowed_q == 0) && ((cpi->oxcf).rc_cfg.worst_allowed_q == 0)) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).hl_sf.accurate_bit_estimate = 0;
    }
    if ((cpi->oxcf).use_highbitdepth == true) {
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 0;
    }
    if ((cpi->oxcf).superres_cfg.enable_superres == true) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 1;
    }
    if (((((pAVar4->b_calculate_psnr != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
         (cpi->compressor_stage != '\x01')) &&
        (((cpi->common).show_frame != 0 && (cpi->is_dropped_frame == false)))) &&
       (((cpi->oxcf).frm_dim_cfg.width != uVar13 || ((cpi->oxcf).frm_dim_cfg.height != uVar14)))) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
    }
    goto LAB_00208316;
  }
  iVar16 = (cpi->common).width;
  iVar21 = (cpi->common).height;
  if (iVar16 < iVar21) {
    iVar21 = iVar16;
  }
  _Var11 = (cpi->oxcf).use_highbitdepth;
  if (iVar21 < 0x1e0) {
    (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
    (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01';
    if (_Var11 != false) {
      (cpi->sf).tx_sf.prune_tx_size_level = 1;
    }
LAB_00207136:
    (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
    (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
    (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
    (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 500;
    (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
    (cpi->sf).part_sf.ml_early_term_after_part_split_level = 1;
    if (speed < 1) goto LAB_00208316;
    (cpi->sf).part_sf.use_square_partition_only_threshold = (0x1df < iVar21) * '\x03' + BLOCK_32X32;
    (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 300;
    (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
    if (speed == 1) goto LAB_00208316;
    (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_32X32;
    (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x400000;
    (cpi->sf).part_sf.partition_search_breakout_rate_thr = 100;
    if (0x1df < iVar21) goto LAB_002071b5;
    if (_Var11 != false) goto LAB_002073d0;
  }
  else {
    (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
    if (iVar21 < 0x2d0) {
      (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x02';
      goto LAB_00207136;
    }
    (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x03';
    if (0x86f < iVar21) {
      (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
    }
    (cpi->sf).mv_sf.use_downsampled_sad = 2;
    if (speed < 1) goto LAB_00208316;
    (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
    (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
    if (speed == 1) goto LAB_00208316;
    (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
    (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x1000000;
    (cpi->sf).part_sf.partition_search_breakout_rate_thr = 0x78;
LAB_002071b5:
    (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 1;
    if (_Var11 != false) {
      iVar7 = 2;
LAB_002073d0:
      (cpi->sf).tx_sf.prune_tx_size_level = iVar7;
    }
  }
  if ((uint)speed < 3) goto LAB_00208316;
  (cpi->sf).part_sf.ml_early_term_after_part_split_level = 0;
  if (iVar21 < 0x2d0) {
    (cpi->sf).part_sf.max_intra_bsize = BLOCK_32X32;
    iVar7 = 0x78;
    iVar8 = 0x800000;
  }
  else {
    iVar7 = 200;
    iVar8 = 0x2000000;
  }
  (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar8;
  (cpi->sf).part_sf.partition_search_breakout_rate_thr = iVar7;
  if (_Var11 != false) {
    (cpi->sf).tx_sf.prune_tx_size_level = 3;
  }
  if (speed == 3) goto LAB_00208316;
  if (iVar21 < 0x2d0) {
    (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x1000000;
    if (iVar21 < 0x1e0) {
      if (((uint)speed < 6) ||
         ((cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16, (uint)speed < 8))
      goto LAB_00208316;
      uVar20 = 2;
      lVar18 = 0x3e0;
      goto LAB_00207fc6;
    }
    (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
    if (((uint)speed < 6) ||
       ((cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16,
       (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01', (uint)speed < 9))
    goto LAB_00208316;
  }
  else {
    (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
    (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
    if ((uint)speed < 6) goto LAB_00208316;
    (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\0';
    if (0x437 < iVar21) {
      (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
    }
    (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16;
    if ((uint)speed < 8) goto LAB_00208316;
    uVar20 = 1;
    lVar18 = 0x49c;
LAB_00207fc6:
    *(undefined4 *)((long)&(cpi->sf).hl_sf.frame_parameter_update + lVar18) = uVar20;
    if ((uint)speed < 9 || 0x86f < iVar21) goto LAB_00208316;
  }
  (cpi->sf).inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_OFF;
  (cpi->sf).inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_OFF;
LAB_00208316:
  if (cpi->ppi->seq_params_locked == 0) {
    pSVar5 = (cpi->common).seq_params;
    pSVar5->enable_masked_compound =
         pSVar5->enable_masked_compound & (cpi->sf).inter_sf.disable_masked_comp == 0;
    bVar6 = pSVar5->enable_interintra_compound & 1;
    if ((cpi->sf).inter_sf.disable_interintra_wedge_var_thresh == 0xffffffff) {
      bVar6 = 0;
    }
    pSVar5->enable_interintra_compound = bVar6;
  }
  set_subpel_search_method
            (&cpi->mv_search_params,(cpi->oxcf).unit_test_cfg.motion_vector_unit_test,
             (cpi->sf).mv_sf.subpel_search_method);
  if ((((cpi->oxcf).row_mt == true) && (1 < (cpi->mt_info).num_workers)) &&
     ((cpi->sf).inter_sf.mv_cost_upd_level == INTERNAL_COST_UPD_SBROW_SET)) {
    (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
  }
  return;
}

Assistant:

void av1_set_speed_features_framesize_dependent(AV1_COMP *cpi, int speed) {
  SPEED_FEATURES *const sf = &cpi->sf;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  switch (oxcf->mode) {
    case GOOD:
      set_good_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
    case ALLINTRA:
      set_allintra_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
    case REALTIME:
      set_rt_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
  }

  if (!cpi->ppi->seq_params_locked) {
    cpi->common.seq_params->enable_masked_compound &=
        !sf->inter_sf.disable_masked_comp;
    cpi->common.seq_params->enable_interintra_compound &=
        (sf->inter_sf.disable_interintra_wedge_var_thresh != UINT_MAX);
  }

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  // For multi-thread use case with row_mt enabled, cost update for a set of
  // SB rows is not desirable. Hence, the sf mv_cost_upd_level is set to
  // INTERNAL_COST_UPD_SBROW in such cases.
  if ((cpi->oxcf.row_mt == 1) && (cpi->mt_info.num_workers > 1)) {
    if (sf->inter_sf.mv_cost_upd_level == INTERNAL_COST_UPD_SBROW_SET) {
      // Set mv_cost_upd_level to use row level update.
      sf->inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    }
  }
}